

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

CTcSymbol * CTcSymMetaclassBase::read_from_sym_file(CVmFile *fp)

{
  tc_symtype_t tVar1;
  tctarg_obj_id_t tVar2;
  int idx_00;
  CTcGenTarg *__s;
  CTcPrsSymtab *this;
  CTcSymMetaclass *sym_00;
  int idx;
  CTcSymMetaclass *sym;
  CTcSymbol *old_sym;
  size_t idlen;
  char id [256];
  char *txt;
  textchar_t *in_stack_fffffffffffffe88;
  CTcPrsSymtab *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  CVmFile *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  CTcGenTarg *this_00;
  CVmFile *in_stack_fffffffffffffee0;
  CTcSymMetaclassBase *local_8;
  
  __s = (CTcGenTarg *)CTcSymbolBase::base_read_from_sym_file(in_stack_fffffffffffffee0);
  if (__s == (CTcGenTarg *)0x0) {
    local_8 = (CTcSymMetaclassBase *)0x0;
  }
  else {
    CVmFile::read_byte((CVmFile *)in_stack_fffffffffffffe90);
    CVmFile::read_bytes(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        (size_t)in_stack_fffffffffffffe90);
    this = CTcParser::get_global_symtab(G_prs);
    this_00 = __s;
    strlen((char *)__s);
    local_8 = (CTcSymMetaclassBase *)
              CTcPrsSymtab::find(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0x20ddd7);
    if ((local_8 == (CTcSymMetaclassBase *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_8), tVar1 != TC_SYM_METACLASS)) {
      local_8 = (CTcSymMetaclassBase *)CTcSymbolBase::operator_new(0x20de0f);
      sym_00 = (CTcSymMetaclass *)strlen((char *)__s);
      tVar2 = CTcGenTarg::new_obj_id(G_cg);
      CTcSymMetaclass::CTcSymMetaclass
                ((CTcSymMetaclass *)this,(char *)CONCAT44(tVar2,in_stack_fffffffffffffea8),
                 (size_t)sym_00,(int)((ulong)__s >> 0x20),(int)__s,
                 (tctarg_obj_id_t)((ulong)local_8 >> 0x20));
      set_ext(local_8,1);
      idx_00 = CTcGenTarg::find_or_add_meta
                         (this_00,(char *)this,CONCAT44(tVar2,in_stack_fffffffffffffea8),sym_00);
      set_meta_idx(local_8,idx_00);
    }
  }
  return &local_8->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymMetaclassBase::read_from_sym_file(class CVmFile *fp)
{
    /* read the symbol name */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID string */
    char id[256];
    size_t idlen = (uchar)fp->read_byte();
    fp->read_bytes(id, idlen);

    /* if the symbol is already defined, return the existing copy */
    CTcSymbol *old_sym = G_prs->get_global_symtab()->find(txt, strlen(txt));
    if (old_sym != 0 && old_sym->get_type() == TC_SYM_METACLASS)
        return old_sym;

    /* create a new external metaclass symbol */
    CTcSymMetaclass *sym = new CTcSymMetaclass(
        txt, strlen(txt), FALSE, 0, G_cg->new_obj_id());

    /* mark it as external */
    sym->set_ext(TRUE);

    /* add it to the metaclass table */
    int idx = G_cg->find_or_add_meta(id, idlen, sym);

    /* set the index in the symbol */
    sym->set_meta_idx(idx);

    /* return the new symbol */
    return sym;
}